

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
vkt::shaderexecutor::Functions::Mul::doApply
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *xi;
  Interval *yi;
  deRoundingMode dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Interval local_50;
  Interval local_38;
  
  xi = iargs->a;
  yi = iargs->b;
  if ((xi->m_hasNaN & 1U) == 0) {
    dVar6 = xi->m_lo;
    dVar2 = xi->m_hi;
    if ((((dVar6 <= dVar2) && (dVar6 != -INFINITY)) && (dVar2 != INFINITY)) &&
       ((yi->m_hasNaN & 1U) == 0)) {
      dVar3 = yi->m_lo;
      dVar4 = yi->m_hi;
      if (((dVar3 <= dVar4) && (dVar3 != -INFINITY)) && (dVar4 != INFINITY)) {
        local_50.m_hasNaN = false;
        local_50.m_lo = INFINITY;
        local_50.m_hi = -INFINITY;
        dVar5 = -dVar2;
        dVar7 = dVar5;
        if (dVar5 <= dVar2) {
          dVar7 = dVar6;
        }
        if (0.0 <= dVar7) {
          if (0.0 <= (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar3 |
                             (ulong)-dVar4 & -(ulong)(dVar2 < 0.0))) {
            dVar1 = deGetRoundingMode();
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar6 = iargs->a->m_lo;
            dVar2 = iargs->b->m_lo;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar6 = dVar6 * dVar2;
            local_50.m_hasNaN = NAN(dVar6);
            dVar2 = -INFINITY;
            if (!local_50.m_hasNaN) {
              dVar2 = dVar6;
            }
            dVar3 = INFINITY;
            if (!local_50.m_hasNaN) {
              dVar3 = dVar6;
            }
            dVar7 = iargs->a->m_hi * iargs->b->m_hi;
            dVar6 = -INFINITY;
            dVar4 = INFINITY;
            if (!NAN(dVar7)) {
              dVar6 = dVar7;
              dVar4 = dVar7;
            }
            local_50.m_hasNaN = local_50.m_hasNaN || NAN(dVar7);
            local_50.m_lo =
                 (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 |
                         (ulong)dVar3 & -(ulong)(dVar3 <= dVar4));
            local_50.m_hi =
                 (double)(~-(ulong)(dVar6 <= dVar2) & (ulong)dVar6 |
                         (ulong)dVar2 & -(ulong)(dVar6 <= dVar2));
            deSetRoundingMode(dVar1);
          }
          else {
            if (0.0 < (double)(~-(ulong)(dVar2 < dVar5) & (ulong)dVar4 |
                              (ulong)-dVar3 & -(ulong)(dVar2 < dVar5))) goto LAB_008cfd3a;
            dVar1 = deGetRoundingMode();
            deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
            dVar6 = iargs->a->m_hi;
            dVar2 = iargs->b->m_lo;
            deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
            dVar6 = dVar6 * dVar2;
            local_50.m_hasNaN = NAN(dVar6);
            dVar2 = -INFINITY;
            if (!local_50.m_hasNaN) {
              dVar2 = dVar6;
            }
            dVar3 = INFINITY;
            if (!local_50.m_hasNaN) {
              dVar3 = dVar6;
            }
            dVar7 = iargs->a->m_lo * iargs->b->m_hi;
            dVar6 = -INFINITY;
            dVar4 = INFINITY;
            if (!NAN(dVar7)) {
              dVar6 = dVar7;
              dVar4 = dVar7;
            }
            local_50.m_hasNaN = local_50.m_hasNaN || NAN(dVar7);
            local_50.m_lo =
                 (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 |
                         (ulong)dVar3 & -(ulong)(dVar3 <= dVar4));
            local_50.m_hi =
                 (double)(~-(ulong)(dVar6 <= dVar2) & (ulong)dVar6 |
                         (ulong)dVar2 & -(ulong)(dVar6 <= dVar2));
            deSetRoundingMode(dVar1);
          }
          tcu::FloatFormat::roundOut(&local_38,&ctx->format,&local_50,true);
          tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_38);
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_008cfd3a:
  FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,xi,yi);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		Interval a = iargs.a;
		Interval b = iargs.b;

		// Fast-path for common case
		if (a.isOrdinary() && b.isOrdinary())
		{
			Interval ret;
			if (a.hi() < 0)
			{
				a = -a;
				b = -b;
			}
			if (a.lo() >= 0 && b.lo() >= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.lo() * iargs.b.lo(),
										prod = iargs.a.hi() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
			if (a.lo() >= 0 && b.hi() <= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.hi() * iargs.b.lo(),
										prod = iargs.a.lo() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
		}
		return this->applyMonotone(ctx, iargs.a, iargs.b);
	}